

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.h
# Opt level: O3

SampledSpectrum __thiscall
pbrt::BlackbodySpectrum::Sample(BlackbodySpectrum *this,SampledWavelengths *lambda)

{
  float fVar1;
  float fVar2;
  array<float,_4> aVar3;
  long lVar4;
  float n2;
  float fVar5;
  float fVar6;
  SampledSpectrum s;
  undefined8 local_28;
  undefined8 uStack_20;
  
  lVar4 = 0;
  local_28 = 0;
  uStack_20 = 0;
  fVar1 = this->T;
  fVar2 = this->normalizationFactor;
  do {
    fVar6 = 0.0;
    if (0.0 < fVar1) {
      fVar6 = (lambda->lambda).values[lVar4] * 1e-09;
      fVar5 = expf(1.9864457e-25 / (fVar1 * fVar6 * 1.3806487e-23));
      fVar6 = 1.1910428e-16 / ((fVar5 + -1.0) * fVar6 * fVar6 * fVar6 * fVar6 * fVar6);
      if (NAN(fVar6)) {
        LogFatal<char_const(&)[11]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/spectrum.h"
                   ,0x4c,"Check failed: %s",(char (*) [11])"!IsNaN(Le)");
      }
    }
    *(float *)((long)&local_28 + lVar4 * 4) = fVar6 * fVar2;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  aVar3.values[2] = (float)(undefined4)uStack_20;
  aVar3.values[3] = (float)uStack_20._4_4_;
  aVar3.values[0] = (float)(undefined4)local_28;
  aVar3.values[1] = (float)local_28._4_4_;
  return (array<float,_4>)(array<float,_4>)aVar3.values;
}

Assistant:

Sample(const SampledWavelengths &lambda) const {
        SampledSpectrum s;
        for (int i = 0; i < NSpectrumSamples; ++i)
            s[i] = Blackbody(lambda[i], T) * normalizationFactor;
        return s;
    }